

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,PatternPtr *underlyingPattern)

{
  Pattern::Pattern(&this->super_Pattern,
                   &((underlyingPattern->
                     super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_name);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__ExcludedPattern_0024b708;
  clara::std::__shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_underlyingPattern).
              super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>,
             &underlyingPattern->
              super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

TestSpec::ExcludedPattern::ExcludedPattern( PatternPtr const& underlyingPattern )
    : Pattern( underlyingPattern->name() )
    , m_underlyingPattern( underlyingPattern )
    {}